

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_reg_name(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  uint uVar2;
  char *pcVar3;
  size_t initialOffset;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  initialOffset._4_4_ = curi_status_success;
  do {
    if (initialOffset._4_4_ != curi_status_success) {
      return curi_status_success;
    }
    sVar1 = *offset;
    pcVar3 = read_char(uri,len,offset);
    uVar2 = (int)*pcVar3 - 0x21;
    if (uVar2 < 0x5d || *pcVar3 == 0x7e) {
      switch((long)&switchD_00102cec::switchdataD_00105328 +
             (long)(int)(&switchD_00102cec::switchdataD_00105328)[uVar2]) {
      case 0x102cee:
        break;
      case 0x102cf0:
        initialOffset._4_4_ = parse_h8(uri,len,offset,settings,userData);
        break;
      case 0x102d0e:
        break;
      case 0x102d10:
        goto switchD_00102cec_caseD_102d10;
      }
    }
    else {
switchD_00102cec_caseD_102d10:
      initialOffset._4_4_ = curi_status_error;
    }
    if (initialOffset._4_4_ == curi_status_error) {
      *offset = sVar1;
    }
  } while( true );
}

Assistant:

static curi_status parse_reg_name(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // reg-name = *( unreserved / "%" h8 / sub-delims )
    curi_status status = curi_status_success;

    while (status == curi_status_success)
    {
        size_t initialOffset = *offset;
        switch (*read_char(uri,len,offset))
        {
            CASE_UNRESERVED:
                break;
            case '%':
                status = parse_h8(uri, len, offset, settings, userData);
                break;
            CASE_SUB_DELIMS:
                break;
            default:
                status = curi_status_error;
        }
        if (status == curi_status_error)
            *offset = initialOffset;
    }

    return curi_status_success;
}